

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_iceguy.cpp
# Opt level: O2

int AF_A_IceGuyChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double dVar1;
  double dVar2;
  VM_UBYTE VVar3;
  DObject *this;
  bool bVar4;
  int iVar5;
  uint uVar6;
  AActor *pAVar7;
  AActor *self;
  char *__assertion;
  FName local_44;
  DAngle local_40;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053f00f;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self == (AActor *)0x0) {
LAB_0053ee87:
        self = (AActor *)0x0;
      }
      else {
        bVar4 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053f00f;
        }
      }
      if (numparam == 1) goto LAB_0053ef07;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_0053efff;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar4) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053f00f;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053efff;
      }
      if ((((uint)numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053ef07:
        A_Chase(stack,self);
        iVar5 = FRandom::operator()(&pr_iceguychase);
        if (iVar5 < 0x80) {
          iVar5 = FRandom::operator()(&pr_iceguychase);
          dVar1 = self->radius;
          dVar2 = (self->Angles).Yaw.Degrees;
          uVar6 = FRandom::operator()(&pr_iceguylook);
          FName::FName(&local_44,WispTypes[uVar6 & 1]);
          local_40.Degrees = dVar2 + 90.0;
          AActor::Vec3Angle(&local_38,self,(double)(iVar5 + -0x80) * dVar1 * 0.0078125,&local_40,
                            60.0,false);
          pAVar7 = Spawn(&local_44,&local_38,ALLOW_REPLACE);
          if (pAVar7 != (AActor *)0x0) {
            (pAVar7->Vel).Z = (self->Vel).Z;
            dVar1 = (self->Vel).Y;
            (pAVar7->Vel).X = (self->Vel).X;
            (pAVar7->Vel).Y = dVar1;
            (pAVar7->target).field_0.p = self;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053f00f;
    }
    if (self == (AActor *)0x0) goto LAB_0053ee87;
  }
LAB_0053efff:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053f00f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                ,0x34,"int AF_A_IceGuyChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceGuyChase)
{
	PARAM_ACTION_PROLOGUE;

	double dist;
	DAngle an;
	AActor *mo;

	A_Chase(stack, self);
	if (pr_iceguychase() < 128)
	{
		dist = (pr_iceguychase() - 128) * self->radius / 128.;
		an = self->Angles.Yaw + 90;
		mo = Spawn(WispTypes[pr_iceguylook() & 1], self->Vec3Angle(dist, an, 60.), ALLOW_REPLACE);
		if (mo)
		{
			mo->Vel = self->Vel;
			mo->target = self;
		}
	}
	return 0;
}